

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O3

void __thiscall
cmTargetIncludeDirectoriesCommand::HandleMissingTarget
          (cmTargetIncludeDirectoriesCommand *this,string *name)

{
  cmMakefile *this_00;
  ostream *poVar1;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Cannot specify include directories for target \"",0x2f);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\" which is not built by this project.",0x25);
  this_00 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmTargetIncludeDirectoriesCommand::HandleMissingTarget(
  const std::string& name)
{
  std::ostringstream e;
  e << "Cannot specify include directories for target \"" << name
    << "\" which is not built by this project.";
  this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
}